

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_gl_engine.cpp
# Opt level: O2

void __thiscall
polyscope::render::backend_openGL_mock::GLCompiledProgram::addUniqueUniform
          (GLCompiledProgram *this,ShaderSpecUniform *newUniform)

{
  pointer pGVar1;
  __type _Var2;
  pointer __lhs;
  GLShaderUniform GStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  __lhs = (this->uniforms).
          super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderUniform>_>
          ._M_impl.super__Vector_impl_data._M_start;
  pGVar1 = (this->uniforms).
           super__Vector_base<polyscope::render::backend_openGL_mock::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderUniform>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (__lhs == pGVar1) {
      std::__cxx11::string::string((string *)&GStack_68,(string *)newUniform);
      GStack_68.type = newUniform->type;
      GStack_68.isSet = false;
      std::
      vector<polyscope::render::backend_openGL_mock::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL_mock::GLShaderUniform>_>
      ::emplace_back<polyscope::render::backend_openGL_mock::GLShaderUniform>
                (&this->uniforms,&GStack_68);
LAB_00243501:
      std::__cxx11::string::~string((string *)&GStack_68);
      return;
    }
    _Var2 = std::operator==(&__lhs->name,&newUniform->name);
    if (_Var2) {
      if (__lhs->type == newUniform->type) {
        return;
      }
      std::operator+(&GStack_68.name,"uniform ",&__lhs->name);
      std::operator+(&local_40,&GStack_68.name," appears twice in program with different types");
      exception(&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      goto LAB_00243501;
    }
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

void GLCompiledProgram::addUniqueUniform(ShaderSpecUniform newUniform) {
  for (GLShaderUniform& u : uniforms) {
    if (u.name == newUniform.name) {

      // if it occurs twice, confirm that the occurences match
      if (u.type != newUniform.type) exception("uniform " + u.name + " appears twice in program with different types");

      return;
    }
  }
  uniforms.push_back(GLShaderUniform{newUniform.name, newUniform.type, false});
}